

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

void * ma_calloc(size_t sz,ma_allocation_callbacks *pAllocationCallbacks)

{
  void *__s;
  
  if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
    __s = malloc(sz);
  }
  else if (pAllocationCallbacks->onMalloc == (_func_void_ptr_size_t_void_ptr *)0x0) {
    __s = (void *)0x0;
  }
  else {
    __s = (*pAllocationCallbacks->onMalloc)(sz,pAllocationCallbacks->pUserData);
  }
  if (sz != 0 && __s != (void *)0x0) {
    memset(__s,0,sz);
  }
  return __s;
}

Assistant:

MA_API void* ma_calloc(size_t sz, const ma_allocation_callbacks* pAllocationCallbacks)
{
    void* p = ma_malloc(sz, pAllocationCallbacks);
    if (p != NULL) {
        MA_ZERO_MEMORY(p, sz);
    }

    return p;
}